

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

value * mjs::string_search(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                          string *str,value *regexp)

{
  regexp_object *this;
  double n;
  gc_heap_ptr<mjs::regexp_object> local_38;
  value *local_28;
  value *regexp_local;
  string *str_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_28 = regexp;
  regexp_local = (value *)str;
  str_local = (string *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)__return_storage_ptr__;
  anon_unknown_35::to_regexp_object((anon_unknown_35 *)&local_38,global,regexp);
  this = gc_heap_ptr<mjs::regexp_object>::operator->(&local_38);
  n = regexp_object::search(this,(string *)regexp_local);
  value::value(__return_storage_ptr__,n);
  gc_heap_ptr<mjs::regexp_object>::~gc_heap_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

value string_search(const gc_heap_ptr<global_object>& global, const string& str, const value& regexp) {
    return value{to_regexp_object(global, regexp)->search(str)};
}